

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::SkelRoot>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,SkelRoot *skelroot,string *prop_name,Property *out_prop)

{
  const_iterator cVar1;
  undefined8 uVar2;
  _Base_ptr extraout_RAX;
  unexpected_type<const_char_*> local_28;
  
  if (out_prop == (Property *)0x0) {
    local_28.m_error = "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_28);
    cVar1._M_node = extraout_RAX;
  }
  else {
    cVar1 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)&skelroot->props,prop_name);
    if ((_Rb_tree_header *)cVar1._M_node == &(skelroot->props)._M_t._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = false;
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)out_prop);
      (out_prop->_attrib)._varying_authored = (bool)cVar1._M_node[3].field_0x4;
      (out_prop->_attrib)._variability = cVar1._M_node[3]._M_color;
      ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
      linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar1._M_node[4]._M_parent);
      (out_prop->_attrib)._var._blocked = SUB41(cVar1._M_node[5]._M_color,0);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=(&(out_prop->_attrib)._var._ts._samples,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&cVar1._M_node[5]._M_parent);
      (out_prop->_attrib)._var._ts._dirty = SUB41(cVar1._M_node[6]._M_color,0);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &(out_prop->_attrib)._paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &cVar1._M_node[6]._M_parent);
      AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar1._M_node + 7));
      *(_Base_ptr *)&out_prop->_listOpQual = cVar1._M_node[0x17]._M_parent;
      (out_prop->_rel).type = *(Type *)&cVar1._M_node[0x17]._M_left;
      Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar1._M_node[0x17]._M_right);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &(out_prop->_rel).targetPathVector,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &cVar1._M_node[0x1e]._M_parent);
      (out_prop->_rel).listOpQual = cVar1._M_node[0x1f]._M_color;
      AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar1._M_node[0x1f]._M_parent);
      (out_prop->_rel)._varying_authored = *(bool *)&cVar1._M_node[0x2f]._M_left;
      uVar2 = ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
      out_prop->_has_custom = *(bool *)&cVar1._M_node[0x30]._M_right;
      cVar1._M_node = (_Base_ptr)CONCAT71((int7)((ulong)uVar2 >> 8),1);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = true;
    }
  }
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)cVar1._M_node;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const SkelRoot &skelroot, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  {
    const auto it = skelroot.props.find(prop_name);
    if (it == skelroot.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());

  return true;
}